

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::vprint(FILE *f,string_view format_str,format_args args)

{
  size_t sVar1;
  size_t sVar2;
  system_error *this;
  int *piVar3;
  string_view message;
  memory_buffer buffer;
  buffer<char> local_230;
  char local_210 [504];
  
  local_230.size_ = 0;
  local_230._vptr_buffer = (_func_int **)&PTR_grow_00799960;
  local_230.capacity_ = 500;
  local_230.ptr_ = local_210;
  detail::vformat_to<char>
            (&local_230,format_str,
             args.
             super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             ,(locale_ref)0x0);
  sVar1 = local_230.size_;
  sVar2 = fwrite(local_230.ptr_,1,local_230.size_,(FILE *)f);
  if (sVar1 <= sVar2) {
    if (local_230.ptr_ != local_210) {
      operator_delete(local_230.ptr_,local_230.capacity_);
    }
    return;
  }
  this = (system_error *)__cxa_allocate_exception(0x18);
  piVar3 = __errno_location();
  message.size_ = 0x14;
  message.data_ = "cannot write to file";
  system_error::system_error<>(this,*piVar3,message);
  __cxa_throw(this,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str,
                     basic_format_args<buffer_context<char>>(args));
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(buffer.data(), buffer.size()));
    auto written = detail::dword();
    if (!detail::WriteConsoleW(reinterpret_cast<void*>(_get_osfhandle(fd)),
                               u16.c_str(), static_cast<uint32_t>(u16.size()),
                               &written, nullptr)) {
      FMT_THROW(format_error("failed to write to console"));
    }
    return;
  }
#endif
  detail::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}